

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::LockFile(PosixEnv *this,string *filename,FileLock **lock)

{
  bool bVar1;
  int iVar2;
  char *__file;
  int *piVar3;
  void *pvVar4;
  undefined8 *in_RCX;
  string *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int lock_errno;
  int fd;
  string *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Slice *in_stack_ffffffffffffff28;
  PosixFileLock *in_stack_ffffffffffffff30;
  PosixLockTable *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string local_90 [36];
  int local_6c;
  string local_58 [52];
  int local_24;
  undefined8 *local_20;
  string *local_18;
  
  *in_RCX = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  __file = (char *)std::__cxx11::string::c_str();
  local_24 = open(__file,0x80042,0x1a4);
  if (local_24 < 0) {
    __errno_location();
    PosixError(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  }
  else {
    bVar1 = PosixLockTable::Insert(in_stack_ffffffffffffff50,in_RSI);
    if (bVar1) {
      iVar2 = LockOrUnlock((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                           SUB81((ulong)in_stack_ffffffffffffff30 >> 0x18,0));
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        local_6c = *piVar3;
        close(local_24);
        PosixLockTable::Remove
                  ((PosixLockTable *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
        std::operator+((char *)in_RSI,in_RDI);
        PosixError(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        std::__cxx11::string::~string(local_90);
      }
      else {
        pvVar4 = operator_new(0x30);
        iVar2 = local_24;
        std::__cxx11::string::string((string *)&stack0xffffffffffffff50,local_18);
        PosixFileLock::PosixFileLock
                  (in_stack_ffffffffffffff30,(int)((ulong)pvVar4 >> 0x20),
                   (string *)CONCAT44(iVar2,in_stack_ffffffffffffff20));
        *local_20 = pvVar4;
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
        Status::OK();
      }
    }
    else {
      close(local_24);
      std::operator+((char *)in_RSI,in_RDI);
      Slice::Slice((Slice *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18);
      Slice::Slice((Slice *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (char *)in_stack_ffffffffffffff18);
      Status::IOError(in_stack_ffffffffffffff28,
                      (Slice *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      std::__cxx11::string::~string(local_58);
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status LockFile(const std::string& filename, FileLock** lock) override {
    *lock = nullptr;

    int fd = ::open(filename.c_str(), O_RDWR | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!locks_.Insert(filename)) {
      ::close(fd);
      return Status::IOError("lock " + filename, "already held by process");
    }

    if (LockOrUnlock(fd, true) == -1) {
      int lock_errno = errno;
      ::close(fd);
      locks_.Remove(filename);
      return PosixError("lock " + filename, lock_errno);
    }

    *lock = new PosixFileLock(fd, filename);
    return Status::OK();
  }